

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.h
# Opt level: O1

void TTD::SnapShot::
     ParseListHelper<void(*)(TTD::NSSnapValues::SnapRootInfoEntry*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::SnapRootInfoEntry,512ul>
               (_func_void_SnapRootInfoEntry_ptr_bool_FileReader_ptr_SlabAllocatorBase<0>_ptr
                *parseFunc,UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *list,
               FileReader *snapreader,SlabAllocator *alloc)

{
  uint32 uVar1;
  SnapRootInfoEntry *pSVar2;
  uint32 uVar3;
  
  uVar1 = FileReader::ReadLengthValue(snapreader,true);
  FileReader::ReadSequenceStart_WDefaultKey(snapreader,true);
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      pSVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::NextOpenEntry(list);
      (*parseFunc)(pSVar2,uVar3 != 0,snapreader,alloc);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  (*snapreader->_vptr_FileReader[5])(snapreader);
  return;
}

Assistant:

static void ParseListHelper(Fn parseFunc, UnorderedArrayList<T, allocSize>& list, FileReader* snapreader, SlabAllocator& alloc)
        {
            uint32 count = snapreader->ReadLengthValue(true);
            snapreader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < count; ++i)
            {
                T* into = list.NextOpenEntry();
                (*parseFunc)(into, i != 0, snapreader, alloc);
            }
            snapreader->ReadSequenceEnd();
        }